

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnpapi.c
# Opt level: O1

int UpnpAcceptSubscriptionExt
              (UpnpDevice_Handle Hnd,char *DevID_const,char *ServName_const,IXML_Document *PropSet,
              char *SubsId)

{
  Upnp_Handle_Type UVar1;
  uint uVar2;
  int iVar3;
  Handle_Info **HndInfo;
  Handle_Info *SInfo;
  Handle_Info *local_30;
  
  local_30 = (Handle_Info *)0x0;
  iVar3 = 6;
  UpnpPrintf(UPNP_ALL,API,".upnp/src/api/upnpapi.c",0xaec,"Inside UpnpAcceptSubscription\n");
  if (UpnpSdkInit == 1) {
    HandleReadLock((char *)0xaf5,iVar3);
    HndInfo = &local_30;
    UVar1 = GetHandleInfo(Hnd,HndInfo);
    iVar3 = (int)HndInfo;
    if (UVar1 == HND_DEVICE) {
      if (DevID_const == (char *)0x0) {
        HandleUnlock((char *)0xb01,iVar3);
        uVar2 = 0xffffff9b;
        iVar3 = 0xb02;
      }
      else if (ServName_const == (char *)0x0) {
        HandleUnlock((char *)0xb07,iVar3);
        uVar2 = 0xffffff9b;
        iVar3 = 0xb08;
      }
      else if (SubsId == (char *)0x0) {
        HandleUnlock((char *)0xb0d,iVar3);
        uVar2 = 0xffffff9b;
        iVar3 = 0xb0e;
      }
      else {
        HandleUnlock((char *)0xb1d,iVar3);
        uVar2 = genaInitNotifyExt(Hnd,DevID_const,ServName_const,PropSet,SubsId);
        iVar3 = 0xb1f;
      }
    }
    else {
      HandleUnlock((char *)0xafb,iVar3);
      uVar2 = 0xffffff9c;
      iVar3 = 0xafc;
    }
  }
  else {
    uVar2 = 0xffffff8c;
    iVar3 = 0xaf0;
  }
  UpnpPrintf(UPNP_ALL,API,".upnp/src/api/upnpapi.c",iVar3,
             "Exiting UpnpAcceptSubscription, ret = %d.\n",(ulong)uVar2);
  return uVar2;
}

Assistant:

int UpnpAcceptSubscriptionExt(UpnpDevice_Handle Hnd,
	const char *DevID_const,
	const char *ServName_const,
	IXML_Document *PropSet,
	const Upnp_SID SubsId)
{
	int ret = 0;
	int line = 0;
	struct Handle_Info *SInfo = NULL;
	char *DevID = (char *)DevID_const;
	char *ServName = (char *)ServName_const;

	UpnpPrintf(UPNP_ALL,
		API,
		__FILE__,
		__LINE__,
		"Inside UpnpAcceptSubscription\n");

	if (UpnpSdkInit != 1) {
		line = __LINE__;
		ret = UPNP_E_FINISH;
		goto exit_function;
	}

	HandleReadLock(__FILE__, __LINE__);

	switch (GetHandleInfo(Hnd, &SInfo)) {
	case HND_DEVICE:
		break;
	default:
		HandleUnlock(__FILE__, __LINE__);
		line = __LINE__;
		ret = UPNP_E_INVALID_HANDLE;
		goto exit_function;
	}
	if (DevID == NULL) {
		HandleUnlock(__FILE__, __LINE__);
		line = __LINE__;
		ret = UPNP_E_INVALID_PARAM;
		goto exit_function;
	}
	if (ServName == NULL) {
		HandleUnlock(__FILE__, __LINE__);
		line = __LINE__;
		ret = UPNP_E_INVALID_PARAM;
		goto exit_function;
	}
	if (SubsId == NULL) {
		HandleUnlock(__FILE__, __LINE__);
		line = __LINE__;
		ret = UPNP_E_INVALID_PARAM;
		goto exit_function;
	}
		/* Now accepts an empty state list, so the code below is
		 * commented out */
		#if 0
	if (PropSet == NULL) {
		HandleUnlock(__FILE__, __LINE__);
		line = __LINE__;
		ret = UPNP_E_INVALID_PARAM;
		goto exit_function;
	}
		#endif

	HandleUnlock(__FILE__, __LINE__);

	line = __LINE__;
	ret = genaInitNotifyExt(Hnd, DevID, ServName, PropSet, SubsId);

exit_function:
	UpnpPrintf(UPNP_ALL,
		API,
		__FILE__,
		line,
		"Exiting UpnpAcceptSubscription, ret = %d.\n",
		ret);

	return ret;
}